

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::CreateSymbol_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *this;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this_00;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  JavascriptSymbol *result;
  Var res;
  RecyclableObject *__obj;
  JavascriptString *descriptionString;
  Var description;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  this = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (this == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)22>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  descriptionString = (JavascriptString *)InflateVarInReplay(executeContext,origVar);
  if (descriptionString == (JavascriptString *)0x0) {
    pJVar3 = Js::ScriptContext::GetLibrary(this);
    __obj = &Js::JavascriptLibrary::GetEmptyString(pJVar3)->super_RecyclableObject;
  }
  else {
    if (descriptionString == (JavascriptString *)0x0) {
      return;
    }
    bVar1 = Js::VarIs<Js::RecyclableObject>(descriptionString);
    if (bVar1) {
      this_00 = Js::VarTo<Js::RecyclableObject>(descriptionString);
      pSVar2 = Js::RecyclableObject::GetScriptContext(this_00);
      if (pSVar2 != this) {
        descriptionString = (JavascriptString *)Js::CrossSite::MarshalVar(this,this_00,false);
      }
    }
    __obj = &Js::JavascriptConversion::ToString(descriptionString,this)->super_RecyclableObject;
  }
  pJVar3 = Js::ScriptContext::GetLibrary(this);
  result = Js::JavascriptLibrary::CreateSymbol(pJVar3,(JavascriptString *)__obj);
  JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)22>
            (executeContext,evt,result);
  return;
}

Assistant:

void CreateSymbol_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::CreateSymbolActionTag>(evt);
            Js::Var description = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::JavascriptString* descriptionString;
            if(description != nullptr)
            {
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(description, ctx);
                descriptionString = Js::JavascriptConversion::ToString(description, ctx);
            }
            else
            {
                descriptionString = ctx->GetLibrary()->GetEmptyString();
            }
            Js::Var res = ctx->GetLibrary()->CreateSymbol(descriptionString);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::CreateSymbolActionTag>(executeContext, evt, res);
        }